

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O2

void duckdb_re2::ConvertRunesToBytes(bool latin1,Rune *runes,int nrunes,string *bytes)

{
  int iVar1;
  ulong uVar2;
  undefined7 in_register_00000039;
  pointer str;
  ulong uVar3;
  bool bVar4;
  
  if ((int)CONCAT71(in_register_00000039,latin1) != 0) {
    std::__cxx11::string::resize((ulong)bytes);
    uVar2 = 0;
    uVar3 = (ulong)(uint)nrunes;
    if (nrunes < 1) {
      uVar3 = uVar2;
    }
    for (; uVar3 != uVar2; uVar2 = uVar2 + 1) {
      (bytes->_M_dataplus)._M_p[uVar2] = (char)runes[uVar2];
    }
    return;
  }
  std::__cxx11::string::resize((ulong)bytes);
  str = (bytes->_M_dataplus)._M_p;
  uVar3 = 0;
  if (0 < nrunes) {
    uVar3 = (ulong)(uint)nrunes;
  }
  while (bVar4 = uVar3 != 0, uVar3 = uVar3 - 1, bVar4) {
    iVar1 = runetochar(str,runes);
    str = str + iVar1;
    runes = runes + 1;
  }
  std::__cxx11::string::resize((ulong)bytes);
  std::__cxx11::string::shrink_to_fit();
  return;
}

Assistant:

void ConvertRunesToBytes(bool latin1, Rune* runes, int nrunes,
                         std::string* bytes) {
  if (latin1) {
    bytes->resize(nrunes);
    for (int i = 0; i < nrunes; i++)
      (*bytes)[i] = static_cast<char>(runes[i]);
  } else {
    bytes->resize(nrunes * UTFmax);  // worst case
    char* p = &(*bytes)[0];
    for (int i = 0; i < nrunes; i++)
      p += runetochar(p, &runes[i]);
    bytes->resize(p - &(*bytes)[0]);
    bytes->shrink_to_fit();
  }
}